

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

void __thiscall
binlog::Session::Channel::Channel
          (Channel *this,Session *session,size_t queueCapacity,WriterProp *writerProp_)

{
  char *pcVar1;
  
  WriterProp::WriterProp(&this->writerProp,writerProp_);
  pcVar1 = (char *)operator_new__(queueCapacity + 0x38);
  (this->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar1;
  pcVar1[0] = -0x44;
  pcVar1[1] = -0x44;
  pcVar1[2] = '4';
  pcVar1[3] = 'm';
  pcVar1[4] = 'q';
  pcVar1[5] = '?';
  pcVar1[6] = '!';
  pcVar1[7] = -2;
  *(Session **)(pcVar1 + 8) = session;
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  *(size_t *)(pcVar1 + 0x20) = queueCapacity;
  *(char **)(pcVar1 + 0x28) = pcVar1 + 0x38;
  pcVar1[0x30] = '\0';
  pcVar1[0x31] = '\0';
  pcVar1[0x32] = '\0';
  pcVar1[0x33] = '\0';
  pcVar1[0x34] = '\0';
  pcVar1[0x35] = '\0';
  pcVar1[0x36] = '\0';
  pcVar1[0x37] = '\0';
  return;
}

Assistant:

inline Session::Channel::Channel(Session& session, std::size_t queueCapacity, WriterProp writerProp_)
  :writerProp(std::move(writerProp_)),
   _queue(new char[sizeof(std::uint64_t) + sizeof(Session*) + sizeof(detail::Queue) + queueCapacity])
{
  // To be able to recover unconsumed queue data from memory dumps,
  // put a magic number, a pointer to the owning session, the queue and the queue buffer
  // next to each other.
  char* buffer = _queue.get();

  // The magic number is used to indentify the queue in the memory dump
  new (buffer) std::uint64_t(0xFE213F716D34BCBC);
  buffer += sizeof(std::uint64_t);

  // Session* is used to separate the queues of different sessions of the program
  new (buffer) Session*(&session);
  buffer += sizeof(Session*);

  // Queue is used normally to store log events, and also during recovery,
  // to determine the unconsumed parts of the buffer.
  static_assert(alignof(detail::Queue) <= alignof(std::uint64_t), "");
  static_assert(alignof(detail::Queue) <= alignof(Session*), "");
  char* queueBuffer = buffer + sizeof(detail::Queue);
  new (buffer) detail::Queue(queueBuffer, queueCapacity);
}